

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::cancel(BuildSystemFrontendDelegate *this)

{
  long lVar1;
  int iVar2;
  
  lVar1 = *(long *)((long)this->impl + 0x30);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(lVar1 + 0x28));
  if (iVar2 == 0) {
    *(undefined1 *)(lVar1 + 0x50) = 1;
    if (*(BuildSystem **)(lVar1 + 0x20) != (BuildSystem *)0x0) {
      BuildSystem::cancel(*(BuildSystem **)(lVar1 + 0x20));
    }
    pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x28));
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void BuildSystemFrontendDelegate::cancel() {
  auto delegateImpl = static_cast<BuildSystemFrontendDelegateImpl*>(impl);
  delegateImpl->frontend->cancel();
}